

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

Vec_Int_t * Ivy_ManDfs(Ivy_Man_t *p)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  Vec_Int_t *vNodes;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  
  if (p->nObjs[4] != 0) {
    __assert_fail("Ivy_ManLatchNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                  ,0x5c,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
  }
  lVar5 = (long)p->vObjs->nSize;
  if (0 < lVar5) {
    lVar9 = 0;
    do {
      pvVar4 = p->vObjs->pArray[lVar9];
      if ((pvVar4 != (void *)0x0) && ((*(byte *)((long)pvVar4 + 8) & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                      ,0x5f,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
      }
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  iVar2 = p->nObjs[5];
  iVar3 = p->nObjs[6];
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < (iVar3 + iVar2) - 1U) {
    iVar8 = iVar3 + iVar2;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  vNodes->pArray = piVar6;
  pVVar7 = p->vPos;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      Ivy_ManDfs_rec(p,(Ivy_Obj_t *)
                       (*(ulong *)((long)pVVar7->pArray[lVar5] + 0x10) & 0xfffffffffffffffe),vNodes)
      ;
      lVar5 = lVar5 + 1;
      pVVar7 = p->vPos;
    } while (lVar5 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      if (pVVar7->pArray[lVar5] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar5] + 8);
        *pbVar1 = *pbVar1 & 0xef;
      }
      lVar5 = lVar5 + 1;
      pVVar7 = p->vObjs;
    } while (lVar5 < pVVar7->nSize);
  }
  if (vNodes->nSize == p->nObjs[6] + p->nObjs[5] + p->nObjs[7]) {
    return vNodes;
  }
  __assert_fail("Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                ,0x6a,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
}

Assistant:

Vec_Int_t * Ivy_ManDfs( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    assert( Ivy_ManLatchNum(p) == 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );
    return vNodes;
}